

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

bool __thiscall
MT32Emu::Synth::initTimbres
          (Synth *this,Bit16u mapAddress,Bit16u offset,Bit16u count,Bit16u startTimbre,
          bool compressed)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  undefined6 in_register_0000000a;
  ulong uVar5;
  undefined6 in_register_00000012;
  uint uVar6;
  undefined6 in_register_00000032;
  char *fmt;
  ulong uVar7;
  uint uVar8;
  
  uVar3 = (int)CONCAT62(in_register_0000000a,count) * 2;
  uVar6 = 0;
  do {
    uVar6 = uVar6 & 0xffff;
    if (uVar3 <= uVar6) {
LAB_0015ce1f:
      return uVar3 <= uVar6;
    }
    uVar1 = *(ushort *)
             (this->controlROMData +
             (ulong)uVar6 + (CONCAT62(in_register_00000032,mapAddress) & 0xffffffff));
    uVar7 = (ulong)uVar1;
    iVar2 = (int)CONCAT62(in_register_00000012,offset);
    if (!compressed) {
      if ((uint)uVar1 + iVar2 < 0xff0b) {
        MemoryRegion::write(&this->timbresMemoryRegion->super_MemoryRegion,(uint)startTimbre,
                            (void *)0x0,
                            (size_t)(this->controlROMData + ((uint)uVar1 + iVar2 & 0xffff)));
        goto LAB_0015cde8;
      }
      fmt = 
      "Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre address 0x%04x"
      ;
      uVar5 = (ulong)(uint)startTimbre;
LAB_0015ce18:
      printDebug(this,fmt,(ulong)uVar6,uVar5,uVar7);
      goto LAB_0015ce1f;
    }
    uVar8 = (uint)uVar1 + iVar2 & 0xffff;
    bVar4 = initCompressedTimbre(this,startTimbre,this->controlROMData + uVar8,0x10000 - uVar8);
    if (!bVar4) {
      fmt = 
      "Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre at 0x%04x";
      uVar5 = (ulong)startTimbre;
      uVar7 = (ulong)uVar8;
      goto LAB_0015ce18;
    }
LAB_0015cde8:
    startTimbre = startTimbre + 1;
    uVar6 = uVar6 + 2;
  } while( true );
}

Assistant:

bool Synth::initTimbres(Bit16u mapAddress, Bit16u offset, Bit16u count, Bit16u startTimbre, bool compressed) {
	const Bit8u *timbreMap = &controlROMData[mapAddress];
	for (Bit16u i = 0; i < count * 2; i += 2) {
		Bit16u address = (timbreMap[i + 1] << 8) | timbreMap[i];
		if (!compressed && (address + offset + sizeof(TimbreParam) > CONTROL_ROM_SIZE)) {
			printDebug("Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre address 0x%04x", i, startTimbre, address);
			return false;
		}
		address += offset;
		if (compressed) {
			if (!initCompressedTimbre(startTimbre, &controlROMData[address], CONTROL_ROM_SIZE - address)) {
				printDebug("Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre at 0x%04x", i, startTimbre, address);
				return false;
			}
		} else {
			timbresMemoryRegion->write(startTimbre, 0, &controlROMData[address], sizeof(TimbreParam), true);
		}
		startTimbre++;
	}
	return true;
}